

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

int Bmc_CollapseExpandRound
              (sat_solver *pSat,sat_solver *pSatOn,Vec_Int_t *vLits,Vec_Int_t *vNums,
              Vec_Int_t *vTemp,int nBTLimit,int fCanon,int fOnOffSetLit)

{
  int iVar1;
  int Lit;
  int iVar2;
  uint uVar3;
  int Entry;
  int i;
  
  i = vLits->nSize;
  iVar1 = i;
LAB_0045fcd7:
  do {
    iVar1 = iVar1 + -1;
    if (i < 1) {
      return 0;
    }
    i = i + -1;
    Lit = Vec_IntEntry(vLits,i);
  } while (Lit == -1);
  if (pSatOn != (sat_solver *)0x0) {
    if (fOnOffSetLit != -1) {
      __assert_fail("fOnOffSetLit == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                    ,0x174,
                    "int Bmc_CollapseExpandRound(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    if ((fCanon != 0) && (iVar2 = Abc_LitIsCompl(Lit), iVar2 == 0)) goto LAB_0045fcd7;
    vTemp->nSize = 0;
    for (iVar2 = 0; iVar2 < vLits->nSize; iVar2 = iVar2 + 1) {
      uVar3 = Vec_IntEntry(vLits,iVar2);
      if (uVar3 != 0xffffffff) {
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf5,"int Abc_LitNotCond(int, int)");
        }
        Vec_IntPush(vTemp,uVar3 ^ iVar1 == iVar2);
      }
    }
    iVar2 = sat_solver_solve(pSatOn,vTemp->pArray,vTemp->pArray + vTemp->nSize,(long)nBTLimit,0,0,0)
    ;
    if (iVar2 == -1) goto LAB_0045fcd7;
    if (iVar2 == 0) {
      return -1;
    }
  }
  Vec_IntWriteEntry(vLits,i,-1);
  vTemp->nSize = 0;
  if (-1 < fOnOffSetLit) {
    Vec_IntPush(vTemp,fOnOffSetLit);
  }
  for (iVar2 = 0; iVar2 < vLits->nSize; iVar2 = iVar2 + 1) {
    Entry = Vec_IntEntry(vLits,iVar2);
    if (Entry != -1) {
      Vec_IntPush(vTemp,Entry);
    }
  }
  iVar2 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,(long)nBTLimit,0,0,0);
  if (iVar2 == 1) {
    Vec_IntWriteEntry(vLits,i,Lit);
  }
  else if (iVar2 == 0) {
    return -1;
  }
  goto LAB_0045fcd7;
}

Assistant:

int Bmc_CollapseExpandRound( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit )
{
    int fProfile = 0;
    int k, n, iLit, status;
    abctime clk;
    // try removing one literal at a time
    for ( k = Vec_IntSize(vLits) - 1; k >= 0; k-- )
    {
        int Save = Vec_IntEntry( vLits, k );
        if ( Save == -1 )
            continue;
        // check if this literal when expanded overlaps with the on-set
        if ( pSatOn )
        {
            assert( fOnOffSetLit == -1 );
            // it is ok to skip the first round if the literal is positive
            if ( fCanon && !Abc_LitIsCompl(Save) )
                continue;
            // put into new array
            Vec_IntClear( vTemp );
            Vec_IntForEachEntry( vLits, iLit, n )
                if ( iLit != -1 )
                    Vec_IntPush( vTemp, Abc_LitNotCond(iLit, k==n) );
            // check against onset
            if ( fProfile ) clk = Abc_Clock();
            status = sat_solver_solve( pSatOn, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
            if ( fProfile ) clkCheck1 += Abc_Clock() - clk;
            if ( status == l_Undef )
                return -1;
            //printf( "%d", status == l_True );
            if ( status == l_False )
            {
                if ( fProfile ) clkCheckU += Abc_Clock() - clk;
                continue;
            }
            if ( fProfile ) clkCheckS += Abc_Clock() - clk;
            // otherwise keep trying to remove it
        }
        Vec_IntWriteEntry( vLits, k, -1 );
        // put into new array
        Vec_IntClear( vTemp );
        if ( fOnOffSetLit >= 0 )
            Vec_IntPush( vTemp, fOnOffSetLit );
        Vec_IntForEachEntry( vLits, iLit, n )
            if ( iLit != -1 )
                Vec_IntPush( vTemp, iLit );
        // check against offset
        if ( fProfile ) clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( fProfile ) clkCheck2 += Abc_Clock() - clk;
//        if ( fOnOffSetLit >= 0 )
//            Vec_IntPop( vTemp );
        if ( status == l_Undef )
            return -1;
        if ( status == l_True )
        {
            Vec_IntWriteEntry( vLits, k, Save );
            if ( fProfile ) clkCheckS += Abc_Clock() - clk;
        }
        else
            if ( fProfile ) clkCheckU += Abc_Clock() - clk;
    }
//    if ( pSatOn )
//    printf( "\n" );
    return 0;
}